

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref cashew::ValueBuilder::makeReturn(Ref value)

{
  char *pcVar1;
  char cVar2;
  Value *pVVar3;
  Ref RVar4;
  void *pvVar5;
  Ref local_30;
  Ref value_local;
  
  local_30.inst = value.inst;
  pVVar3 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar3->type = Null;
  pVVar3 = Value::setArray(pVVar3,2);
  pvVar5 = (void *)0x18;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar4.inst)->type = Null;
  Value::free(RVar4.inst,pvVar5);
  (RVar4.inst)->type = String;
  pcVar1 = WHILE;
  ((RVar4.inst)->field_1).str.str._M_len = RETURN;
  ((RVar4.inst)->field_1).str.str._M_str = pcVar1;
  pVVar3 = Value::push_back(pVVar3,RVar4);
  cVar2 = cashew::Ref::operator!(&local_30);
  RVar4.inst = local_30.inst;
  if (cVar2 != '\0') {
    pvVar5 = (void *)0x18;
    RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar4.inst)->type = Null;
    Value::free(RVar4.inst,pvVar5);
    (RVar4.inst)->type = Null;
  }
  RVar4.inst = Value::push_back(pVVar3,RVar4);
  return (Ref)RVar4.inst;
}

Assistant:

static Ref makeReturn(Ref value) {
    return &makeRawArray(2)
              ->push_back(makeRawString(RETURN))
              .push_back(!!value ? value : makeNull());
  }